

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_decode.c
# Opt level: O0

zip_int64_t
pkware_decrypt(zip_source_t *src,void *ud,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  zip_uint8_t *in;
  int iVar1;
  size_t len_00;
  zip_stat_t *st;
  zip_int64_t n;
  trad_pkware *ctx;
  zip_source_cmd_t cmd_local;
  zip_uint64_t len_local;
  void *data_local;
  void *ud_local;
  zip_source_t *src_local;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    _zip_pkware_keys_reset((zip_pkware_keys_t *)((long)ud + 8));
    in = *ud;
    len_00 = strlen(*ud);
    _zip_pkware_decrypt((zip_pkware_keys_t *)((long)ud + 8),(zip_uint8_t *)0x0,in,len_00);
    iVar1 = decrypt_header(src,(trad_pkware *)ud);
    if (iVar1 < 0) {
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      src_local = (zip_source_t *)0x0;
    }
    break;
  case ZIP_SOURCE_READ:
    src_local = (zip_source_t *)zip_source_read(src,data,len);
    if ((long)src_local < 0) {
      zip_error_set_from_source((zip_error_t *)((long)ud + 0x18),src);
      src_local = (zip_source_t *)0xffffffffffffffff;
    }
    else {
      _zip_pkware_decrypt((zip_pkware_keys_t *)((long)ud + 8),(zip_uint8_t *)data,
                          (zip_uint8_t *)data,(zip_uint64_t)src_local);
    }
    break;
  case ZIP_SOURCE_CLOSE:
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_STAT:
    *(undefined2 *)((long)data + 0x36) = 0;
    *(ulong *)data = *data | 0x80;
    if ((*data & 8) != 0) {
      *(long *)((long)data + 0x20) = *(long *)((long)data + 0x20) + -0xc;
    }
    src_local = (zip_source_t *)0x0;
    break;
  case ZIP_SOURCE_ERROR:
    src_local = (zip_source_t *)zip_error_to_data((zip_error_t *)((long)ud + 0x18),data,len);
    break;
  case ZIP_SOURCE_FREE:
    trad_pkware_free((trad_pkware *)ud);
    src_local = (zip_source_t *)0x0;
    break;
  default:
    src_local = (zip_source_t *)zip_source_pass_to_lower_layer(src,data,len,cmd);
    break;
  case ZIP_SOURCE_SUPPORTS:
    src_local = (zip_source_t *)
                zip_source_make_command_bitmap(ZIP_SOURCE_OPEN,1,2,3,4,5,0x14,0xffffffff);
  }
  return (zip_int64_t)src_local;
}

Assistant:

static zip_int64_t
pkware_decrypt(zip_source_t *src, void *ud, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct trad_pkware *ctx;
    zip_int64_t n;

    ctx = (struct trad_pkware *)ud;

    switch (cmd) {
    case ZIP_SOURCE_OPEN:
        _zip_pkware_keys_reset(&ctx->keys);
        _zip_pkware_decrypt(&ctx->keys, NULL, (const zip_uint8_t *)ctx->password, strlen(ctx->password));
        if (decrypt_header(src, ctx) < 0) {
            return -1;
        }
        return 0;

    case ZIP_SOURCE_READ:
        if ((n = zip_source_read(src, data, len)) < 0) {
            zip_error_set_from_source(&ctx->error, src);
            return -1;
        }

        _zip_pkware_decrypt(&ctx->keys, (zip_uint8_t *)data, (zip_uint8_t *)data, (zip_uint64_t)n);
        return n;

    case ZIP_SOURCE_CLOSE:
        return 0;

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;

        st->encryption_method = ZIP_EM_NONE;
        st->valid |= ZIP_STAT_ENCRYPTION_METHOD;
        if (st->valid & ZIP_STAT_COMP_SIZE) {
            st->comp_size -= ZIP_CRYPTO_PKWARE_HEADERLEN;
        }

        return 0;
    }

    case ZIP_SOURCE_SUPPORTS:
        return zip_source_make_command_bitmap(ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SUPPORTS_REOPEN, -1);

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
        trad_pkware_free(ctx);
        return 0;

    default:
        return zip_source_pass_to_lower_layer(src, data, len, cmd);
    }
}